

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O2

void QTimer::singleShot(nanoseconds ns,TimerType timerType,QObject *receiver,char *member)

{
  QSingleShotTimer *this;
  char *pcVar1;
  long in_FS_OFFSET;
  QByteArrayView local_60;
  QMessageLogger local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (ns.__r < 0) {
    local_50.context.version = 2;
    local_50.context.function._4_4_ = 0;
    local_50.context.line = 0;
    local_50.context.file._0_4_ = 0;
    local_50.context.file._4_4_ = 0;
    local_50.context.function._0_4_ = 0;
    local_50.context.category = "default";
    QMessageLogger::warning
              (&local_50,
               "QTimer::singleShot: negative intervals aren\'t allowed; the interval will be set to 1ms."
              );
    ns.__r = 1000000;
  }
  if (member != (char *)0x0 && receiver != (QObject *)0x0) {
    if (ns.__r == 0) {
      pcVar1 = strchr(member,0x28);
      if ((pcVar1 == (char *)0x0) || (2 < (byte)(*member - 0x30U))) {
        local_50.context.version = 2;
        local_50.context.function._4_4_ = 0;
        local_50.context.line = 0;
        local_50.context.file._0_4_ = 0;
        local_50.context.file._4_4_ = 0;
        local_50.context.function._0_4_ = 0;
        local_50.context.category = "default";
        QMessageLogger::warning(&local_50,"QTimer::singleShot: Invalid slot specification");
      }
      else {
        local_50.context.file = member + 1;
        local_50.context._0_8_ = pcVar1 + ~(ulong)member;
        local_60 = QByteArrayView::trimmed((QByteArrayView *)&local_50);
        QByteArrayView::toByteArray((QByteArray *)&local_50,&local_60);
        pcVar1 = local_50.context.file;
        if (local_50.context.file == (char *)0x0) {
          pcVar1 = &QByteArray::_empty;
        }
        QMetaObject::invokeMethod<>(receiver,pcVar1,QueuedConnection);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_50);
      }
    }
    else {
      this = (QSingleShotTimer *)operator_new(0x18);
      QSingleShotTimer::QSingleShotTimer(this,(Duration)ns.__r,timerType,receiver,member);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTimer::singleShot(std::chrono::nanoseconds ns, Qt::TimerType timerType,
                        const QObject *receiver, const char *member)
{
    if (ns < 0ns) {
        qWarning("QTimer::singleShot: negative intervals aren't allowed; the "
                 "interval will be set to 1ms.");
        ns = 1ms;
    }
    if (receiver && member) {
        if (ns == 0ns) {
            // special code shortpath for 0-timers
            const char* bracketPosition = strchr(member, '(');
            if (!bracketPosition || !(member[0] >= '0' && member[0] <= '2')) {
                qWarning("QTimer::singleShot: Invalid slot specification");
                return;
            }
            const auto methodName = QByteArrayView(member + 1, // extract method name
                                                   bracketPosition - 1 - member).trimmed();
            QMetaObject::invokeMethod(const_cast<QObject *>(receiver), methodName.toByteArray().constData(),
                                      Qt::QueuedConnection);
            return;
        }
        (void) new QSingleShotTimer(ns, timerType, receiver, member);
    }
}